

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Lexer::isPath(Lexer *this,string *token,Type *type)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  string local_58 [36];
  int local_34;
  size_t sStack_30;
  int slashCount;
  size_t marker;
  Type *type_local;
  string *token_local;
  Lexer *this_local;
  
  if ((this->_enablePath & 1U) != 0) {
    sStack_30 = this->_cursor;
    local_34 = 0;
    marker = (size_t)type;
    type_local = (Type *)token;
    token_local = &this->_text;
    while (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar3 == '/') {
      sStack_30 = sStack_30 + 1;
      local_34 = local_34 + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
      if (*pcVar3 == '\0') break;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
      bVar1 = unicodeWhitespace((int)*pcVar3);
      if ((bVar1) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar3 == '/')) break;
      utf8_next_char(&this->_text,&stack0xffffffffffffffd0);
      while( true ) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
        bVar1 = false;
        if (*pcVar3 != '\0') {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
          bVar2 = unicodeWhitespace((int)*pcVar3);
          bVar1 = false;
          if (!bVar2) {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
            bVar1 = *pcVar3 != '/';
          }
        }
        if (!bVar1) break;
        utf8_next_char(&this->_text,&stack0xffffffffffffffd0);
      }
    }
    if ((this->_cursor < sStack_30) && (3 < local_34)) {
      *(undefined4 *)marker = 5;
      std::__cxx11::string::substr((ulong)local_58,(ulong)this);
      std::__cxx11::string::operator=((string *)type_local,local_58);
      std::__cxx11::string::~string(local_58);
      this->_cursor = sStack_30;
      return true;
    }
  }
  return false;
}

Assistant:

bool Lexer::isPath (std::string& token, Lexer::Type& type)
{
  if (_enablePath)
  {
    std::size_t marker = _cursor;
    int slashCount = 0;

    while (1)
    {
      if (_text[marker] == '/')
      {
        ++marker;
        ++slashCount;
      }
      else
        break;

      if (_text[marker] &&
          ! unicodeWhitespace (_text[marker]) &&
          _text[marker] != '/')
      {
        utf8_next_char (_text, marker);
        while (_text[marker] &&
               ! unicodeWhitespace (_text[marker]) &&
               _text[marker] != '/')
          utf8_next_char (_text, marker);
      }
      else
        break;
    }

    if (marker > _cursor &&
        slashCount > 3)
    {
      type = Lexer::Type::path;
      token = _text.substr (_cursor, marker - _cursor);
      _cursor = marker;
      return true;
    }
  }

  return false;
}